

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

String * __thiscall flexbuffers::Reference::AsString(String *__return_storage_ptr__,Reference *this)

{
  byte bVar1;
  uint8_t uVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  long lVar7;
  
  if (this->type_ == FBT_KEY) {
    puVar3 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar4 = (ulong)(byte)*puVar3;
      }
      else {
        uVar4 = (ulong)(ushort)*puVar3;
      }
    }
    else if (bVar1 < 8) {
      uVar4 = (ulong)(uint)*puVar3;
    }
    else {
      uVar4 = *puVar3;
    }
    uVar2 = this->byte_width_;
    uVar5 = strlen((char *)((long)puVar3 - uVar4));
    (__return_storage_ptr__->super_Sized).super_Object.data_ = (uint8_t *)((long)puVar3 - uVar4);
    (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = uVar2;
  }
  else if (this->type_ == FBT_STRING) {
    puVar3 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar4 = (ulong)(byte)*puVar3;
      }
      else {
        uVar4 = (ulong)(ushort)*puVar3;
      }
    }
    else if (bVar1 < 8) {
      uVar4 = (ulong)(uint)*puVar3;
    }
    else {
      uVar4 = *puVar3;
    }
    puVar6 = (uint8_t *)((long)puVar3 - uVar4);
    bVar1 = this->byte_width_;
    lVar7 = -(ulong)bVar1;
    (__return_storage_ptr__->super_Sized).super_Object.data_ = puVar6;
    (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = bVar1;
    if ((ulong)bVar1 < 4) {
      if (bVar1 < 2) {
        uVar5 = (ulong)puVar6[lVar7];
      }
      else {
        uVar5 = (ulong)*(ushort *)(puVar6 + lVar7);
      }
    }
    else if (bVar1 < 8) {
      uVar5 = (ulong)*(uint *)(puVar6 + lVar7);
    }
    else {
      uVar5 = *(ulong *)(puVar6 + lVar7);
    }
  }
  else {
    (__return_storage_ptr__->super_Sized).super_Object.data_ = String::EmptyString()::empty_string;
    (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = '\x01';
    uVar5 = 0;
  }
  (__return_storage_ptr__->super_Sized).size_ = uVar5;
  return __return_storage_ptr__;
}

Assistant:

String AsString() const {
    if (type_ == FBT_STRING) {
      return String(Indirect(), byte_width_);
    } else if (type_ == FBT_KEY) {
      auto key = Indirect();
      return String(key, byte_width_,
                    strlen(reinterpret_cast<const char *>(key)));
    } else {
      return String::EmptyString();
    }
  }